

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.cpp
# Opt level: O2

ssize_t __thiscall
libnbt::NBTTagVector<signed_char>::write
          (NBTTagVector<signed_char> *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  int i;
  long lVar1;
  char temp;
  int32_t size;
  
  size = *(int *)&(this->array).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
         *(int *)&(this->array).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
  writeBytes((ostream *)CONCAT44(in_register_00000034,__fd),(char *)&size,'\x04');
  for (lVar1 = 0; lVar1 < size; lVar1 = lVar1 + 1) {
    temp = (this->array).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start[lVar1];
    writeBytes((ostream *)CONCAT44(in_register_00000034,__fd),&temp,width);
  }
  return (long)size;
}

Assistant:

void NBTTagVector<T>::write(std::ostream &out) {
        auto size = (int32_t) array.size();
        writeBytes(out, (char *) &size, 4);
        for (int i = 0; i < size; i++) {
            T temp = array[i];
            writeBytes(out, (char *) &temp, width);
        }
    }